

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t *bs,void *workspace,short *offcodeNCount,
                        uint *offcodeMaxValue,void *dict,size_t dictSize)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  U32 *pUVar5;
  U32 *headerBuffer;
  bool bVar6;
  bool bVar7;
  uint hasZeroWeights;
  uint matchlengthLog;
  uint maxSymbolValue;
  uint local_c4;
  void *local_c0;
  uint local_b4;
  void *local_b0;
  uint local_a8 [30];
  
  (bs->entropy).huf.repeatMode = HUF_repeat_check;
  local_a8[0] = 0xff;
  local_c4 = 1;
  local_c0 = workspace;
  local_b0 = dict;
  sVar1 = HUF_readCTable((HUF_CElt *)bs,local_a8,(void *)((long)dict + 8),dictSize - 8,&local_c4);
  if (local_c4 == 0) {
    (bs->entropy).huf.repeatMode = HUF_repeat_valid;
  }
  if (local_a8[0] < 0xff || 0xffffffffffffff88 < sVar1) {
    return 0xffffffffffffffe2;
  }
  pUVar5 = (U32 *)(dictSize + (long)local_b0);
  headerBuffer = (U32 *)((long)dict + 8 + sVar1);
  sVar1 = FSE_readNCount(offcodeNCount,offcodeMaxValue,local_a8,headerBuffer,
                         (long)pUVar5 - (long)headerBuffer);
  if ((sVar1 < 0xffffffffffffff89) && (local_a8[0] < 9)) {
    sVar3 = FSE_buildCTable_wksp
                      ((bs->entropy).fse.offcodeCTable,offcodeNCount,0x1f,local_a8[0],local_c0,
                       0x1800);
    bVar6 = sVar3 < 0xffffffffffffff89;
    sVar3 = 0;
    if (bVar6) {
      sVar3 = sVar1;
    }
    headerBuffer = (U32 *)((long)headerBuffer + sVar3);
  }
  else {
    bVar6 = false;
  }
  if (!bVar6) {
    return 0xffffffffffffffe2;
  }
  local_c4 = 0x34;
  sVar1 = FSE_readNCount((short *)local_a8,&local_c4,&local_b4,headerBuffer,
                         (long)pUVar5 - (long)headerBuffer);
  if (local_b4 < 10 && sVar1 < 0xffffffffffffff89) {
    if (local_c4 < 0x34) {
      bVar6 = false;
LAB_0014c608:
      sVar3 = 0xffffffffffffffe2;
    }
    else {
      sVar3 = 0;
      lVar4 = 0;
      do {
        bVar7 = *(short *)((long)local_a8 + lVar4 * 2) == 0;
        bVar6 = !bVar7;
        if (bVar7) goto LAB_0014c608;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x35);
    }
    if (!bVar6) goto LAB_0014c65c;
    sVar3 = 0xffffffffffffffe2;
    sVar2 = FSE_buildCTable_wksp
                      ((bs->entropy).fse.matchlengthCTable,(short *)local_a8,local_c4,local_b4,
                       local_c0,0x1800);
    if (0xffffffffffffff88 < sVar2) goto LAB_0014c5ed;
    headerBuffer = (U32 *)((long)headerBuffer + sVar1);
    bVar6 = true;
  }
  else {
LAB_0014c5ed:
    sVar3 = 0xffffffffffffffe2;
LAB_0014c65c:
    bVar6 = false;
  }
  if (!bVar6) {
    return sVar3;
  }
  local_c4 = 0x23;
  sVar1 = FSE_readNCount((short *)local_a8,&local_c4,&local_b4,headerBuffer,
                         (long)pUVar5 - (long)headerBuffer);
  if (local_b4 < 10 && sVar1 < 0xffffffffffffff89) {
    sVar2 = 0xffffffffffffffe2;
    if (local_c4 < 0x23) {
      bVar6 = false;
    }
    else {
      lVar4 = 0;
      do {
        bVar7 = *(short *)((long)local_a8 + lVar4 * 2) == 0;
        bVar6 = !bVar7;
        if (bVar7) goto LAB_0014c6d7;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x24);
      sVar2 = 0;
    }
LAB_0014c6d7:
    if (bVar6) {
      sVar2 = FSE_buildCTable_wksp
                        ((bs->entropy).fse.litlengthCTable,(short *)local_a8,local_c4,local_b4,
                         local_c0,0x1800);
      if (sVar2 < 0xffffffffffffff89) {
        headerBuffer = (U32 *)((long)headerBuffer + sVar1);
        bVar6 = true;
        goto LAB_0014c70a;
      }
      goto LAB_0014c6a2;
    }
  }
  else {
LAB_0014c6a2:
    sVar2 = 0xffffffffffffffe2;
  }
  bVar6 = false;
  sVar3 = sVar2;
LAB_0014c70a:
  if (bVar6) {
    sVar3 = 0xffffffffffffffe2;
    if (headerBuffer + 3 <= pUVar5) {
      bs->rep[0] = *headerBuffer;
      bs->rep[1] = headerBuffer[1];
      bs->rep[2] = headerBuffer[2];
      sVar3 = (long)(headerBuffer + 3) - (long)local_b0;
    }
  }
  return sVar3;
}

Assistant:

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t* bs, void* workspace,
                         short* offcodeNCount, unsigned* offcodeMaxValue,
                         const void* const dict, size_t dictSize)
{
    const BYTE* dictPtr = (const BYTE*)dict;    /* skip magic num and dict ID */
    const BYTE* const dictEnd = dictPtr + dictSize;
    dictPtr += 8;
    bs->entropy.huf.repeatMode = HUF_repeat_check;

    {   unsigned maxSymbolValue = 255;
        unsigned hasZeroWeights = 1;
        size_t const hufHeaderSize = HUF_readCTable((HUF_CElt*)bs->entropy.huf.CTable, &maxSymbolValue, dictPtr,
            dictEnd-dictPtr, &hasZeroWeights);

        /* We only set the loaded table as valid if it contains all non-zero
         * weights. Otherwise, we set it to check */
        if (!hasZeroWeights)
            bs->entropy.huf.repeatMode = HUF_repeat_valid;

        RETURN_ERROR_IF(HUF_isError(hufHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(maxSymbolValue < 255, dictionary_corrupted);
        dictPtr += hufHeaderSize;
    }

    {   unsigned offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted);
        /* Defer checking offcodeMaxValue because we need to know the size of the dictionary content */
        /* fill all offset symbols to avoid garbage at end of table */
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.offcodeCTable,
                offcodeNCount, MaxOff, offcodeLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted);
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted);
        /* Every match length code must have non-zero probability */
        FORWARD_IF_ERROR( ZSTD_checkDictNCount(matchlengthNCount, matchlengthMaxValue, MaxML));
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.matchlengthCTable,
                matchlengthNCount, matchlengthMaxValue, matchlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted);
        /* Every literal length code must have non-zero probability */
        FORWARD_IF_ERROR( ZSTD_checkDictNCount(litlengthNCount, litlengthMaxValue, MaxLL));
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.litlengthCTable,
                litlengthNCount, litlengthMaxValue, litlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted);
    bs->rep[0] = MEM_readLE32(dictPtr+0);
    bs->rep[1] = MEM_readLE32(dictPtr+4);
    bs->rep[2] = MEM_readLE32(dictPtr+8);
    dictPtr += 12;

    return dictPtr - (const BYTE*)dict;
}